

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderPrimitiveCounter::GetGeometryShaderCode
          (string *__return_storage_ptr__,GeometryShaderPrimitiveCounter *this,string *max_vertices,
          string *layout_in,string *layout_out,string *emit_vertices,string *n_iterations)

{
  string *psVar1;
  ulong local_80;
  size_t template_position;
  string local_70 [8];
  string template_name;
  allocator<char> local_3a;
  byte local_39;
  string *local_38;
  string *emit_vertices_local;
  string *layout_out_local;
  string *layout_in_local;
  string *max_vertices_local;
  GeometryShaderPrimitiveCounter *this_local;
  string *m_geometry_shader_template;
  
  local_39 = 0;
  local_38 = emit_vertices;
  emit_vertices_local = layout_out;
  layout_out_local = layout_in;
  layout_in_local = max_vertices;
  max_vertices_local = (string *)this;
  this_local = (GeometryShaderPrimitiveCounter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(<-LAYOUT-IN->)                                  in;\nlayout(<-LAYOUT-OUT->, max_vertices =<-MAX-VERTICES->) out;\n\nflat out int test_gl_PrimitiveIDIn;\n\nvoid main()\n{\n    for (int i=0; i<<-N_ITERATIONS->; i++)\n    {\n        <-EMIT-VERTICES->\n        EndPrimitive();\n    }\n}\n"
             ,&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"<-MAX-VERTICES->",(allocator<char> *)((long)&template_position + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&template_position + 7));
  local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  while (local_80 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_80,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  }
  std::__cxx11::string::operator=(local_70,"<-LAYOUT-IN->");
  local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  while (local_80 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_80,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  }
  std::__cxx11::string::operator=(local_70,"<-LAYOUT-OUT->");
  local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  while (local_80 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_80,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  }
  std::__cxx11::string::operator=(local_70,"<-EMIT-VERTICES->");
  local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  while (local_80 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_80,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  }
  std::__cxx11::string::operator=(local_70,"<-N_ITERATIONS->");
  local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  while (local_80 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::length();
    psVar1 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_80,psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar1);
    local_80 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_70);
  }
  local_39 = 1;
  std::__cxx11::string::~string(local_70);
  if ((local_39 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderPrimitiveCounter::GetGeometryShaderCode(const std::string& max_vertices,
																  const std::string& layout_in,
																  const std::string& layout_out,
																  const std::string& emit_vertices,
																  const std::string& n_iterations)
{
	/* Geometry shader template code */
	std::string m_geometry_shader_template = "${VERSION}\n"
											 "\n"
											 "${GEOMETRY_SHADER_REQUIRE}\n"
											 "\n"
											 "precision highp float;\n"
											 "\n"
											 "layout(<-LAYOUT-IN->)                                  in;\n"
											 "layout(<-LAYOUT-OUT->, max_vertices =<-MAX-VERTICES->) out;\n"
											 "\n"
											 "flat out int test_gl_PrimitiveIDIn;\n"
											 "\n"
											 "void main()\n"
											 "{\n"
											 "    for (int i=0; i<<-N_ITERATIONS->; i++)\n"
											 "    {\n"
											 "        <-EMIT-VERTICES->\n"
											 "        EndPrimitive();\n"
											 "    }\n"
											 "}\n";

	/* Max number of emited vertices */
	std::string template_name	 = "<-MAX-VERTICES->";
	std::size_t template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), max_vertices);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* In primitive type */
	template_name	 = "<-LAYOUT-IN->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), layout_in);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Out primitive type */
	template_name	 = "<-LAYOUT-OUT->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), layout_out);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Vertex emit code */
	template_name	 = "<-EMIT-VERTICES->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), emit_vertices);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Number of iterations, during which we'll be emitting vertices */
	template_name	 = "<-N_ITERATIONS->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), n_iterations);

		template_position = m_geometry_shader_template.find(template_name);
	}

	return m_geometry_shader_template;
}